

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::constraintSecondPartialDerivativeWRTState
          (ConstraintsGroup *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *lambda,MatrixDynSize *hessian)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *psVar5;
  element_type *peVar6;
  long *plVar7;
  undefined8 uVar8;
  bool bVar9;
  char cVar10;
  Index size;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  void *__s;
  long lVar14;
  long lVar15;
  long lVar16;
  string *psVar17;
  ostream *poVar18;
  ulong uVar19;
  reverse_iterator constraintIterator;
  ostringstream errorMsg;
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *local_1e0;
  shared_ptr<iDynTree::optimalcontrol::TimedConstraint> local_1d0;
  pointer local_1c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b8;
  double local_1b0;
  pointer local_1a8 [14];
  ios_base local_138 [264];
  
  local_1b0 = time;
  bVar9 = isAnyTimeGroup(this);
  if (!bVar9) {
    uVar11 = iDynTree::VectorDynSize::size();
    iDynTree::VectorDynSize::size();
    iDynTree::MatrixDynSize::resize((ulong)hessian,uVar11);
    psVar5 = (this->m_pimpl->orderedIntervals).
             super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1a8[0] = (this->m_pimpl->orderedIntervals).
                   super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>>,__gnu_cxx::__ops::_Iter_pred<iDynTree::optimalcontrol::ConstraintsGroup::ConstraintsGroupPimpl::findActiveConstraint(double)::_lambda(std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&)_1_>>
              (SUB84(local_1b0,0),&local_1c0);
    if (local_1c0 !=
        (this->m_pimpl->orderedIntervals).
        super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar15 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      iDynTree::VectorDynSize::size();
      uVar12 = iDynTree::VectorDynSize::data();
      uVar13 = iDynTree::VectorDynSize::size();
      uVar11 = uVar13;
      if (((uVar12 & 7) == 0) &&
         (uVar11 = (ulong)((uint)(uVar12 >> 3) & 1), (long)uVar13 <= (long)uVar11)) {
        uVar11 = uVar13;
      }
      lVar16 = uVar13 - uVar11;
      if (0 < (long)uVar11) {
        uVar19 = 0;
        do {
          *(undefined8 *)(uVar12 + uVar19 * 8) = *(undefined8 *)(lVar15 + uVar19 * 8);
          uVar19 = uVar19 + 1;
        } while (uVar11 != uVar19);
      }
      uVar19 = (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
      if (1 < lVar16) {
        do {
          puVar1 = (undefined8 *)(lVar15 + uVar11 * 8);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)(uVar12 + uVar11 * 8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          uVar11 = uVar11 + 2;
        } while ((long)uVar11 < (long)uVar19);
      }
      if ((long)uVar19 < (long)uVar13) {
        do {
          *(undefined8 *)(uVar12 + uVar19 * 8) = *(undefined8 *)(lVar15 + uVar19 * 8);
          uVar19 = uVar19 + 1;
        } while (uVar13 != uVar19);
      }
      peVar6 = local_1c0[-1].
               super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      plVar7 = *(long **)&peVar6->constraint;
      cVar10 = (**(code **)(*plVar7 + 0x50))
                         (SUB84(local_1b0,0),plVar7,state,control,&peVar6->lambdaBuffer,hessian);
      if (cVar10 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Failed to evaluate ",0x13);
        psVar17 = Constraint::name_abi_cxx11_
                            (*(Constraint **)
                              &(local_1c0[-1].
                                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->constraint);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(psVar17->_M_dataplus)._M_p,
                             psVar17->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
        std::ostream::put((char)poVar18);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("ConstraintsGroup","constraintSecondPartialDerivativeWRTState",(char *)psVar5);
      }
      else {
        lVar15 = iDynTree::MatrixDynSize::rows();
        lVar16 = iDynTree::VectorDynSize::size();
        if (lVar15 == lVar16) {
          lVar15 = iDynTree::MatrixDynSize::cols();
          lVar16 = iDynTree::VectorDynSize::size();
          if (lVar15 == lVar16) {
            return true;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "The second partial derivative WRT the state of constraint ",0x3a);
          psVar17 = Constraint::name_abi_cxx11_
                              (*(Constraint **)
                                &(local_1c0[-1].
                                  super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->constraint);
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar17->_M_dataplus)._M_p,
                               psVar17->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18," has a number of columns different from the size of the state.",0x3e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
          std::ostream::put((char)poVar18);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("ConstraintsGroup","constraintSecondPartialDerivativeWRTState",(char *)psVar5);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "The second partial derivative WRT the state of constraint ",0x3a);
          psVar17 = Constraint::name_abi_cxx11_
                              (*(Constraint **)
                                &(local_1c0[-1].
                                  super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->constraint);
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar17->_M_dataplus)._M_p,
                               psVar17->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18," has a number of rows different from the size of the state.",0x3b);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
          std::ostream::put((char)poVar18);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("ConstraintsGroup","constraintSecondPartialDerivativeWRTState",(char *)psVar5);
        }
      }
      if (psVar5 != &local_1d0) {
        operator_delete(psVar5,(ulong)((long)&((local_1d0.
                                                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->constraint).
                                              super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return false;
    }
    __s = (void *)iDynTree::MatrixDynSize::data();
    lVar15 = iDynTree::MatrixDynSize::rows();
    lVar16 = iDynTree::MatrixDynSize::cols();
    uVar12 = lVar16 * lVar15;
    uVar11 = uVar12;
    if ((((ulong)__s & 7) == 0) &&
       (uVar11 = (ulong)((uint)((ulong)__s >> 3) & 1), (long)uVar12 <= (long)uVar11)) {
      uVar11 = uVar12;
    }
    lVar15 = uVar12 - uVar11;
    if (0 < (long)uVar11) {
      memset(__s,0,uVar11 * 8);
    }
    lVar16 = (lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
    if (1 < lVar15) {
      lVar14 = uVar11 + 2;
      if ((long)(uVar11 + 2) < lVar16) {
        lVar14 = lVar16;
      }
      memset((void *)((long)__s + uVar11 * 8),0,(~uVar11 + lVar14 & 0xfffffffffffffffe) * 8 + 0x10);
    }
    if (uVar12 - lVar16 == 0 || (long)uVar12 < lVar16) {
      return true;
    }
    memset((void *)((long)__s + uVar11 * 8 + (lVar15 / 2) * 0x10),0,(uVar12 - lVar16) * 8);
    return true;
  }
  p_Var3 = (this->m_pimpl->group)._M_h._M_before_begin._M_nxt;
  p_Var4 = p_Var3[5]._M_nxt;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3[6]._M_nxt;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_1b8 = this_00;
  cVar10 = (*(code *)p_Var4->_M_nxt->_M_nxt[10]._M_nxt)
                     (SUB84(local_1b0,0),p_Var4->_M_nxt,state,control,lambda,hessian);
  if (cVar10 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Failed to evaluate ",0x13);
    psVar17 = Constraint::name_abi_cxx11_((Constraint *)p_Var4->_M_nxt);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(psVar17->_M_dataplus)._M_p,psVar17->_M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    iDynTree::reportError
              ("ConstraintsGroup","constraintSecondPartialDerivativeWRTState",(char *)local_1e0);
  }
  else {
    lVar15 = iDynTree::MatrixDynSize::rows();
    lVar16 = iDynTree::VectorDynSize::size();
    if (lVar15 == lVar16) {
      lVar15 = iDynTree::MatrixDynSize::cols();
      lVar16 = iDynTree::VectorDynSize::size();
      bVar9 = true;
      if (lVar15 == lVar16) goto LAB_001789c7;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The second partial derivative WRT the state of constraint ",
                 0x3a);
      psVar17 = Constraint::name_abi_cxx11_((Constraint *)p_Var4->_M_nxt);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(psVar17->_M_dataplus)._M_p,
                           psVar17->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18," has a number of columns different from the size of the state.",0x3e);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("ConstraintsGroup","constraintSecondPartialDerivativeWRTState",(char *)local_1e0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The second partial derivative WRT the state of constraint ",
                 0x3a);
      psVar17 = Constraint::name_abi_cxx11_((Constraint *)p_Var4->_M_nxt);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(psVar17->_M_dataplus)._M_p,
                           psVar17->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18," has a number of rows different from the size of the state.",0x3b);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("ConstraintsGroup","constraintSecondPartialDerivativeWRTState",(char *)local_1e0);
    }
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,
                    (ulong)((long)&((local_1d0.
                                     super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->constraint).
                                   super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  bVar9 = false;
LAB_001789c7:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return bVar9;
}

Assistant:

bool ConstraintsGroup::constraintSecondPartialDerivativeWRTState(double time, const VectorDynSize &state, const VectorDynSize &control, const VectorDynSize &lambda, MatrixDynSize &hessian)
        {
            if (isAnyTimeGroup()){
                TimedConstraint_ptr loneConstraint = m_pimpl->group.begin()->second;
                if (!(loneConstraint->constraint->constraintSecondPartialDerivativeWRTState(time, state, control, lambda, hessian))) {
                    std::ostringstream errorMsg;
                    errorMsg << "Failed to evaluate "<< loneConstraint->constraint->name() << std::endl;
                    reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != state.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The second partial derivative WRT the state of constraint "<< loneConstraint->constraint->name() << " has a number of rows different from the size of the state." << std::endl;
                    reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.cols() != state.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The second partial derivative WRT the state of constraint "<< loneConstraint->constraint->name() << " has a number of columns different from the size of the state." << std::endl;
                    reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                return true;
            }

            hessian.resize(state.size(), state.size());

            std::vector< TimedConstraint_ptr >::reverse_iterator constraintIterator = m_pimpl->findActiveConstraint(time);
            if (constraintIterator == m_pimpl->orderedIntervals.rend()){ //no active constraint
                toEigen(hessian).setZero();
                return true;
            }

            toEigen(constraintIterator->get()->lambdaBuffer) = toEigen(lambda).topRows(constraintIterator->get()->lambdaBuffer.size());

            if (!(constraintIterator->get()->constraint->constraintSecondPartialDerivativeWRTState(time, state, control, constraintIterator->get()->lambdaBuffer, hessian))) {
                std::ostringstream errorMsg;
                errorMsg << "Failed to evaluate "<< constraintIterator->get()->constraint->name() << std::endl;
                reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTState", errorMsg.str().c_str());
                return false;
            }

            if (hessian.rows() != state.size()) {
                std::ostringstream errorMsg;
                errorMsg << "The second partial derivative WRT the state of constraint "<< constraintIterator->get()->constraint->name() << " has a number of rows different from the size of the state." << std::endl;
                reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTState", errorMsg.str().c_str());
                return false;
            }

            if (hessian.cols() != state.size()) {
                std::ostringstream errorMsg;
                errorMsg << "The second partial derivative WRT the state of constraint "<< constraintIterator->get()->constraint->name() << " has a number of columns different from the size of the state." << std::endl;
                reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTState", errorMsg.str().c_str());
                return false;
            }

            return true;
        }